

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bool.cpp
# Opt level: O0

void __thiscall Bool::display(Bool *this)

{
  ostream *poVar1;
  Bool *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"cited: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Data).cited);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"type : bool");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"value: ");
  (*(this->super_Data)._vptr_Data[2])();
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Bool::display() {
    std::cout << "cited: " << cited << std::endl;
    std::cout << "type : bool" << std::endl;
    std::cout << "value: ";
    print();
    std::cout << std::endl;
    std::cout << std::endl;
}